

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_functionDefinition_create
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePosition,sysbvm_tuple_t flags,
          sysbvm_tuple_t callingConventionName,sysbvm_tuple_t argumentCount,
          sysbvm_tuple_t definitionEnvironment,sysbvm_tuple_t argumentNodes,
          sysbvm_tuple_t resultTypeNode,sysbvm_tuple_t body)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_object_tuple_t *psVar2;
  
  psVar1 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).functionSourceDefinitionType,5);
  (psVar1->field_1).pointers[0] = sourcePosition;
  psVar1[1].header.field_0.typePointer = definitionEnvironment;
  psVar1[1].header.identityHashAndFlags = (undefined4)argumentNodes;
  psVar1[1].header.objectSize = argumentNodes._4_4_;
  psVar1[1].field_1.pointers[0] = resultTypeNode;
  psVar1[2].header.field_0.typePointer = body;
  psVar2 = sysbvm_context_allocatePointerTuple(context,(context->roots).functionDefinitionType,0x17)
  ;
  psVar2[1].field_1.pointers[0] = flags;
  psVar2[2].header.field_0.typePointer = callingConventionName;
  psVar2[2].header.identityHashAndFlags = (int)argumentCount;
  psVar2[2].header.objectSize = (int)(argumentCount >> 0x20);
  psVar2[4].field_1.pointers[0] = (sysbvm_tuple_t)psVar1;
  psVar2[7].header.field_0.typePointer = 0xb;
  psVar2[8].header.field_0.typePointer = 0xc;
  psVar2[7].field_1.pointers[0] = 0xc;
  psVar2[7].header.identityHashAndFlags = 0xc;
  psVar2[7].header.objectSize = 0;
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionDefinition_create(sysbvm_context_t *context, sysbvm_tuple_t sourcePosition, sysbvm_tuple_t flags, sysbvm_tuple_t callingConventionName, sysbvm_tuple_t argumentCount, sysbvm_tuple_t definitionEnvironment, sysbvm_tuple_t argumentNodes, sysbvm_tuple_t resultTypeNode, sysbvm_tuple_t body)
{
    sysbvm_functionSourceDefinition_t *sourceDefinition = (sysbvm_functionSourceDefinition_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionSourceDefinitionType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_functionSourceDefinition_t));
    sourceDefinition->sourcePosition = sourcePosition;
    sourceDefinition->environment = definitionEnvironment;
    sourceDefinition->argumentNodes = argumentNodes;
    sourceDefinition->resultTypeNode = resultTypeNode;
    sourceDefinition->bodyNode = body;

    sysbvm_functionDefinition_t *result = (sysbvm_functionDefinition_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionDefinitionType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_functionDefinition_t));
    result->flags = flags;
    result->callingConventionName = callingConventionName;
    result->argumentCount = argumentCount; 
    result->sourceDefinition = (sysbvm_tuple_t)sourceDefinition;
    result->boxDescriptor = sysbvm_tuple_uintptr_encode(context, 0);
    result->checkedEntryPoint = sysbvm_tuple_systemHandle_encode(context, 0);
    result->uncheckedEntryPoint = sysbvm_tuple_systemHandle_encode(context, 0);
    result->capturelessUncheckedEntryPoint = sysbvm_tuple_systemHandle_encode(context, 0);
    return (sysbvm_tuple_t)result;
}